

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpipe.cpp
# Opt level: O3

int __thiscall TokenPipeEnd::TokenWrite(TokenPipeEnd *this,uint8_t token)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  long in_FS_OFFSET;
  uint8_t local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_19 = token;
  do {
    sVar2 = write(this->m_fd,&local_19,1);
    if (-1 < sVar2) {
      iVar1 = (uint)(sVar2 != 0) * 2 + -2;
      goto LAB_00de63dc;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  iVar1 = -1;
LAB_00de63dc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int TokenPipeEnd::TokenWrite(uint8_t token)
{
    while (true) {
        ssize_t result = write(m_fd, &token, 1);
        if (result < 0) {
            // Failure. It's possible that the write was interrupted by a signal,
            // in that case retry.
            if (errno != EINTR) {
                return TS_ERR;
            }
        } else if (result == 0) {
            return TS_EOS;
        } else { // ==1
            return 0;
        }
    }
}